

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O0

int32 duh_render_signal(DUH_SIGRENDERER *sigrenderer,float volume,float delta,int32 size,
                       sample_t_conflict **samples)

{
  long lVar1;
  sample_t_conflict **ppsVar2;
  double in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  int j;
  int32 i;
  int32 rendered;
  sample_t_conflict **s;
  int32 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int32 in_stack_ffffffffffffffc8;
  int iVar4;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int32 local_4;
  
  if (in_RDX == 0.0) {
    local_4 = duh_sigrenderer_generate_samples
                        ((DUH_SIGRENDERER *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                         (double)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),0.0,
                         (int32)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                         (sample_t_conflict **)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    ppsVar2 = allocate_sample_buffer(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (ppsVar2 == (sample_t_conflict **)0x0) {
      local_4 = 0;
    }
    else {
      dumb_silence((sample_t_conflict *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
      local_4 = duh_sigrenderer_generate_samples
                          ((DUH_SIGRENDERER *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                           (double)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX,
                           (int32)((ulong)ppsVar2 >> 0x20),
                           (sample_t_conflict **)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x10); iVar3 = iVar3 + 1) {
        for (iVar4 = 0; iVar4 < local_4; iVar4 = iVar4 + 1) {
          lVar1 = *(long *)((long)in_RDX + (long)iVar3 * 8);
          *(sample_t_conflict *)(lVar1 + (long)iVar4 * 4) =
               ((*ppsVar2)[iVar4 * *(int *)(in_RDI + 0x10) + iVar3] >> 8) +
               *(int *)(lVar1 + (long)iVar4 * 4);
        }
      }
      destroy_sample_buffer((sample_t_conflict **)0x83d2ce);
    }
  }
  return local_4;
}

Assistant:

int32 duh_render_signal(
	DUH_SIGRENDERER *sigrenderer,
	float volume, float delta,
	int32 size, sample_t **samples
)
{
	sample_t **s;
	int32 rendered;
	int32 i;
	int j;
	if (!samples) return duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, NULL);
	s = allocate_sample_buffer(sigrenderer->n_channels, size);
	if (!s) return 0;
	dumb_silence(s[0], sigrenderer->n_channels * size);
	rendered = duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, s);
	for (j = 0; j < sigrenderer->n_channels; j++)
		for (i = 0; i < rendered; i++)
			samples[j][i] += s[0][i*sigrenderer->n_channels+j] >> 8;
	destroy_sample_buffer(s);
	return rendered;
}